

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  char *__s2;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar7;
  int ii_1;
  int iCol;
  int nPos;
  u8 *pPos;
  int eDetail;
  int bCmp;
  int nCmp;
  char *zTerm;
  int nCol;
  Fts5VocabTable *pTab;
  Fts5VocabCursor *pCsr;
  u32 ii;
  int iOff;
  i64 iPos;
  int nTerm;
  int rc;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 uVar8;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar9;
  long lVar10;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_24;
  long local_18;
  int local_c;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *in_RDI;
  iVar2 = *(int *)(*(long *)(in_RDI[2] + 0x18) + 0x20);
  local_24 = sqlite3Fts5StructureTest(*(Fts5Index **)(in_RDI[2] + 0x20),(void *)in_RDI[5]);
  if (local_24 == 0) {
    in_RDI[0xb] = in_RDI[0xb] + 1;
    if (*(int *)(lVar4 + 0x38) == 2) {
      local_24 = fts5VocabInstanceNext
                           ((Fts5VocabCursor *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    else {
      if (*(int *)(lVar4 + 0x38) == 0) {
        *(int *)((long)in_RDI + 0x44) = *(int *)((long)in_RDI + 0x44) + 1;
        while ((*(int *)((long)in_RDI + 0x44) < iVar2 &&
               (*(long *)(in_RDI[10] + (long)*(int *)((long)in_RDI + 0x44) * 8) == 0))) {
          *(int *)((long)in_RDI + 0x44) = *(int *)((long)in_RDI + 0x44) + 1;
        }
      }
      local_c = local_24;
      if ((*(int *)(lVar4 + 0x38) != 0) || (iVar2 <= *(int *)((long)in_RDI + 0x44))) {
        if (*(char *)(in_RDI[4] + 0x14) == '\0') {
          __s2 = sqlite3Fts5IterTerm((Fts5IndexIter *)
                                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                     (int *)CONCAT44(in_stack_ffffffffffffff8c,
                                                     in_stack_ffffffffffffff88));
          if (-1 < (int)in_RDI[6]) {
            if ((int)in_RDI[6] < -0x55555555) {
              in_stack_ffffffffffffff88 = (int)in_RDI[6];
            }
            else {
              in_stack_ffffffffffffff88 = -0x55555556;
            }
            iVar6 = memcmp((void *)in_RDI[7],__s2,(long)in_stack_ffffffffffffff88);
            if ((iVar6 < 0) || ((iVar6 == 0 && ((int)in_RDI[6] < -0x55555556)))) {
              *(undefined4 *)(in_RDI + 3) = 1;
              local_24 = 0;
              goto LAB_00294f07;
            }
          }
          sqlite3Fts5BufferSet
                    ((int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (Fts5Buffer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff84,
                     (u8 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          memset((void *)in_RDI[9],0,(long)iVar2 << 3);
          memset((void *)in_RDI[10],0,(long)iVar2 << 3);
          *(undefined4 *)((long)in_RDI + 0x44) = 0;
          while (local_c == 0) {
            iVar6 = *(int *)(*(long *)(in_RDI[2] + 0x18) + 0x74);
            local_18 = 0;
            lVar10 = *(long *)(in_RDI[4] + 8);
            iVar9 = *(int *)(in_RDI[4] + 0x10);
            if (*(int *)(lVar4 + 0x38) == 0) {
              if (iVar6 == 0) {
                in_stack_ffffffffffffff90 = -1;
                uVar8 = 0;
                while (iVar6 = sqlite3Fts5PoslistNext64
                                         ((u8 *)CONCAT44(uVar8,in_stack_ffffffffffffffa0),
                                          (int)((ulong)lVar10 >> 0x20),
                                          (int *)CONCAT44(iVar9,in_stack_ffffffffffffff90),
                                          (i64 *)CONCAT44(in_stack_ffffffffffffff8c,
                                                          in_stack_ffffffffffffff88)), iVar6 == 0) {
                  in_stack_ffffffffffffff8c = 0;
                  if (in_stack_ffffffffffffff90 != 0) {
                    if (iVar2 < 1) {
                      local_c = 0x10b;
                      break;
                    }
                    *(long *)in_RDI[10] = *(long *)in_RDI[10] + 1;
                    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff8c;
                  }
                  *(long *)in_RDI[9] = *(long *)in_RDI[9] + 1;
                }
              }
              else if (iVar6 == 2) {
                uVar8 = 2;
                while (iVar6 = sqlite3Fts5PoslistNext64
                                         ((u8 *)CONCAT44(uVar8,in_stack_ffffffffffffffa0),
                                          (int)((ulong)lVar10 >> 0x20),
                                          (int *)CONCAT44(iVar9,in_stack_ffffffffffffff90),
                                          (i64 *)CONCAT44(in_stack_ffffffffffffff8c,
                                                          in_stack_ffffffffffffff88)), iVar6 == 0) {
                  if (iVar2 < 1) {
                    local_c = 0x10b;
                    break;
                  }
                  *(long *)in_RDI[10] = *(long *)in_RDI[10] + 1;
                }
              }
              else {
                *(long *)in_RDI[10] = *(long *)in_RDI[10] + 1;
              }
            }
            else if (*(int *)(lVar4 + 0x38) == 1) {
              if ((iVar6 == 0) && ((*(uint *)(in_RDI + 8) & 4) != 0)) {
                uVar8 = 1;
                lVar5 = local_18;
                while (local_18 = lVar5, local_18 < iVar9) {
                  bVar1 = *(byte *)(lVar10 + local_18);
                  lVar5 = local_18 + 1;
                  if ((bVar1 & 0x80) != 0) {
                    iVar6 = sqlite3Fts5GetVarint32
                                      ((uchar *)CONCAT44(in_stack_ffffffffffffff8c,
                                                         in_stack_ffffffffffffff88),
                                       (u32 *)CONCAT44(uVar8,in_stack_ffffffffffffff80));
                    lVar5 = iVar6 + local_18;
                  }
                  local_18 = lVar5;
                  if (bVar1 == 1) {
                    lVar5 = local_18 + 1;
                    if ((*(byte *)(lVar10 + local_18) & 0x80) != 0) {
                      iVar6 = sqlite3Fts5GetVarint32
                                        ((uchar *)CONCAT44(in_stack_ffffffffffffff8c,
                                                           in_stack_ffffffffffffff88),
                                         (u32 *)CONCAT44(uVar8,in_stack_ffffffffffffff80));
                      lVar5 = iVar6 + local_18;
                    }
                  }
                  else {
                    *(long *)in_RDI[9] = *(long *)in_RDI[9] + 1;
                    lVar5 = local_18;
                  }
                }
              }
              *(long *)in_RDI[10] = *(long *)in_RDI[10] + 1;
            }
            if (local_c == 0) {
              local_c = sqlite3Fts5IterNextScan
                                  ((Fts5IndexIter *)CONCAT44(iVar9,in_stack_ffffffffffffff90));
            }
            if ((*(int *)(lVar4 + 0x38) == 2) ||
               ((local_c == 0 &&
                ((sqlite3Fts5IterTerm((Fts5IndexIter *)CONCAT44(iVar9,in_stack_ffffffffffffff90),
                                      (int *)CONCAT44(in_stack_ffffffffffffff8c,
                                                      in_stack_ffffffffffffff88)),
                 (int)in_RDI[0xd] != -0x55555556 || (*(char *)(in_RDI[4] + 0x14) != '\0'))))))
            break;
          }
        }
        else {
          *(undefined4 *)(in_RDI + 3) = 1;
        }
      }
      if (((local_c == 0) && ((int)in_RDI[3] == 0)) && (*(int *)(lVar4 + 0x38) == 0)) {
        while( true ) {
          bVar7 = false;
          if (*(int *)((long)in_RDI + 0x44) < iVar2) {
            bVar7 = *(long *)(in_RDI[10] + (long)*(int *)((long)in_RDI + 0x44) * 8) == 0;
          }
          if (!bVar7) break;
          *(int *)((long)in_RDI + 0x44) = *(int *)((long)in_RDI + 0x44) + 1;
        }
        if (*(int *)((long)in_RDI + 0x44) == iVar2) {
          local_c = 0x10b;
        }
      }
      local_24 = local_c;
    }
  }
LAB_00294f07:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return local_24;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int nCol = pCsr->pFts5->pConfig->nCol;
  int rc;

  rc = sqlite3Fts5StructureTest(pCsr->pFts5->pIndex, pCsr->pStruct);
  if( rc!=SQLITE_OK ) return rc;
  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            /* Do not bother counting the number of instances if the "cnt"
            ** column is not being read (according to colUsed).  */
            if( eDetail==FTS5_DETAIL_FULL && (pCsr->colUsed & 0x04) ){
              while( iPos<nPos ){
                u32 ii;
                fts5FastGetVarint32(pPos, iPos, ii);
                if( ii==1 ){
                  /* New column in the position list */
                  fts5FastGetVarint32(pPos, iPos, ii);
                }else{
                  /* An instance - increment pCsr->aCnt[] */
                  pCsr->aCnt[0]++;
                }
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm))
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    for(/* noop */; pCsr->iCol<nCol && pCsr->aDoc[pCsr->iCol]==0; pCsr->iCol++);
    if( pCsr->iCol==nCol ){
      rc = FTS5_CORRUPT;
    }
  }
  return rc;
}